

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void concept_const_suite::input_iterator_equality_comparable(void)

{
  initializer_list<int> __l;
  bool bVar1;
  iterator begin;
  iterator end;
  iterator first;
  size_type length;
  undefined1 local_d0 [8];
  const_iterator d;
  const_iterator c;
  const_iterator b;
  const_iterator a;
  undefined1 local_78 [8];
  circular_view<int,_18446744073709551615UL> span;
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> data;
  
  local_40[0] = 0xb;
  local_40[1] = 0x16;
  local_40[2] = 0x21;
  local_40[3] = 0x2c;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  begin = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_20);
  end = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_20);
  first = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_20);
  length = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_20);
  vista::circular_view<int,18446744073709551615ul>::
  circular_view<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)local_78,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)end._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first._M_current,
             length);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_78);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_78);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)&b.current,(iterator_type *)&b.current);
  boost::detail::test_impl
            ("a == a",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x183,"void concept_const_suite::input_iterator_equality_comparable()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)&b.current,(iterator_type *)&c.current);
  boost::detail::test_impl
            ("a == b",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x184,"void concept_const_suite::input_iterator_equality_comparable()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)&c.current,(iterator_type *)&b.current);
  boost::detail::test_impl
            ("b == a",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x185,"void concept_const_suite::input_iterator_equality_comparable()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)&c.current,(iterator_type *)&d.current);
  boost::detail::test_impl
            ("b == c",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x186,"void concept_const_suite::input_iterator_equality_comparable()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)&b.current,(iterator_type *)&d.current);
  boost::detail::test_impl
            ("a == c",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x187,"void concept_const_suite::input_iterator_equality_comparable()",bVar1);
  _local_d0 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator!=
                    ((basic_iterator<const_int> *)&b.current,(iterator_type *)local_d0);
  boost::detail::test_impl
            ("a != d",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x18a,"void concept_const_suite::input_iterator_equality_comparable()",bVar1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

void input_iterator_equality_comparable()
{
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::const_iterator a = span.begin();
    circular_view<int>::const_iterator b = span.begin();
    circular_view<int>::const_iterator c = span.begin();
    BOOST_TEST(a == a);
    BOOST_TEST(a == b);
    BOOST_TEST(b == a);
    BOOST_TEST(b == c);
    BOOST_TEST(a == c);

    circular_view<int>::const_iterator d = span.end();
    BOOST_TEST(a != d);
}